

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.h
# Opt level: O1

void __thiscall cfd::core::KeyData::~KeyData(KeyData *this)

{
  pointer puVar1;
  pointer puVar2;
  void *pvVar3;
  
  puVar1 = (this->fingerprint_).data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar2 = (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar1 = (this->extpubkey_).tweak_sum_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->extpubkey_).pubkey_.data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->extpubkey_).chaincode_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->extpubkey_).serialize_data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->extprivkey_).tweak_sum_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->extprivkey_).privkey_.data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->extprivkey_).chaincode_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->extprivkey_).serialize_data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->privkey_).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  pvVar3 = (this->pubkey_).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3);
    return;
  }
  return;
}

Assistant:

class CFD_CORE_EXPORT KeyData {
 public:
  /**
   * @brief constructor.
   */
  KeyData();
  /**
   * @brief Get key text information from ext-privkey.
   * @param[in] ext_privkey  privkey
   * @param[in] child_path   bip32 path for child.
   * @param[in] finterprint     master-pubkey fingerprint
   */
  explicit KeyData(
      const ExtPrivkey& ext_privkey, const std::string& child_path,
      const ByteData& finterprint);
  /**
   * @brief Get key text information from ext-pubkey.
   * @param[in] ext_pubkey   pubkey
   * @param[in] child_path   bip32 path for child.
   * @param[in] finterprint     master-pubkey fingerprint
   */
  explicit KeyData(
      const ExtPubkey& ext_pubkey, const std::string& child_path,
      const ByteData& finterprint);
  /**
   * @brief Get key text information from privkey.
   * @param[in] privkey   privkey
   * @param[in] child_path   bip32 path for child.
   * @param[in] finterprint     master-pubkey fingerprint
   */
  explicit KeyData(
      const Privkey& privkey, const std::string& child_path,
      const ByteData& finterprint);
  /**
   * @brief Get key text information from pubkey.
   * @param[in] pubkey   pubkey
   * @param[in] child_path   bip32 path for child.
   * @param[in] finterprint     master-pubkey fingerprint
   */
  explicit KeyData(
      const Pubkey& pubkey, const std::string& child_path,
      const ByteData& finterprint);
  /**
   * @brief Get key text information from ext-privkey.
   * @param[in] ext_privkey  privkey
   * @param[in] child_num_list   bip32 path for child.
   * @param[in] finterprint     master-pubkey fingerprint
   */
  explicit KeyData(
      const ExtPrivkey& ext_privkey,
      const std::vector<uint32_t>& child_num_list,
      const ByteData& finterprint);
  /**
   * @brief Get key text information from ext-pubkey.
   * @param[in] ext_pubkey   pubkey
   * @param[in] child_num_list   bip32 path for child.
   * @param[in] finterprint     master-pubkey fingerprint
   */
  explicit KeyData(
      const ExtPubkey& ext_pubkey, const std::vector<uint32_t>& child_num_list,
      const ByteData& finterprint);
  /**
   * @brief Get key text information from privkey.
   * @param[in] privkey   privkey
   * @param[in] child_num_list   bip32 path for child.
   * @param[in] finterprint     master-pubkey fingerprint
   */
  explicit KeyData(
      const Privkey& privkey, const std::vector<uint32_t>& child_num_list,
      const ByteData& finterprint);
  /**
   * @brief Get key text information from pubkey.
   * @param[in] pubkey   pubkey
   * @param[in] child_num_list   bip32 path for child.
   * @param[in] finterprint     master-pubkey fingerprint
   */
  explicit KeyData(
      const Pubkey& pubkey, const std::vector<uint32_t>& child_num_list,
      const ByteData& finterprint);
  /**
   * @brief Get key text information from string.
   * @param[in] path_info   key-path info.
   * @param[in] child_num   child number to use if an asterisk is used.
   * @param[in] has_schnorr_pubkey   schnorr(xonly) pubkey used.
   */
  explicit KeyData(
      const std::string& path_info, int32_t child_num = -1,
      bool has_schnorr_pubkey = false);

  /**
   * @brief exist ext-privkey.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasExtPrivkey() const;
  /**
   * @brief exist ext-pubkey.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasExtPubkey() const;
  /**
   * @brief exist privkey.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasPrivkey() const;
  /**
   * @brief getting pubkey.
   * @return pubkey
   */
  Pubkey GetPubkey() const;
  /**
   * @brief getting privkey.
   * @return privkey
   */
  Privkey GetPrivkey() const;
  /**
   * @brief getting ext-privkey.
   * @details need ext-privkey exists.
   * @return ext-privkey
   */
  ExtPrivkey GetExtPrivkey() const;
  /**
   * @brief getting ext-pubkey.
   * @details need ext-pubkey exists.
   * @return ext-pubkey
   */
  ExtPubkey GetExtPubkey() const;

  /**
   * @brief Derive ext-privkey.
   * @param[in] path  path
   * @param[in] has_rebase_path  rebase path/fingerprint base
   * @return path info with ext-privkey.
   */
  KeyData DerivePrivkey(
      std::vector<uint32_t> path, bool has_rebase_path) const;
  /**
   * @brief Derive ext-privkey.
   * @param[in] path  path
   * @param[in] has_rebase_path  rebase path/fingerprint base
   * @return path info with ext-privkey.
   */
  KeyData DerivePrivkey(std::string path, bool has_rebase_path) const;
  /**
   * @brief Derive ext-pubkey.
   * @param[in] path  path
   * @param[in] has_rebase_path  rebase path/fingerprint base
   * @return path info with ext-pubkey.
   */
  KeyData DerivePubkey(std::vector<uint32_t> path, bool has_rebase_path) const;
  /**
   * @brief Derive ext-pubkey.
   * @param[in] path  path
   * @param[in] has_rebase_path  rebase path/fingerprint base
   * @return path info with ext-pubkey.
   */
  KeyData DerivePubkey(std::string path, bool has_rebase_path) const;

  /**
   * @brief getting bip32 path.
   * @param[in] hardened_type  hardened string type
   * @param[in] has_hex  using hex string
   * @return bip32 path
   */
  std::string GetBip32Path(
      HardenedType hardened_type = HardenedType::kApostrophe,
      bool has_hex = false) const;
  /**
   * @brief get message string.
   * @param[in] has_pubkey  displays the pubkey string.
   * @param[in] hardened_type  hardened string type
   * @param[in] has_hex  using hex string
   * @return message string.
   */
  std::string ToString(
      bool has_pubkey = true,
      HardenedType hardened_type = HardenedType::kApostrophe,
      bool has_hex = false) const;
  /**
   * @brief get fingerprint.
   * @return fingerprint.
   */
  ByteData GetFingerprint() const;
  /**
   * @brief get child number array.
   * @return child number array.
   */
  std::vector<uint32_t> GetChildNumArray() const;
  /**
   * @brief check valid.
   * @retval true   valid
   * @retval false  invalid
   */
  bool IsValid() const;

 private:
  Pubkey pubkey_;               //!< pubkey
  Privkey privkey_;             //!< privkey
  ExtPrivkey extprivkey_;       //!< ext privkey
  ExtPubkey extpubkey_;         //!< ext pubkey
  std::vector<uint32_t> path_;  //!< bip32 path
  ByteData fingerprint_;        //!< fingerprint by key string
}